

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O1

void memSwap(void *buf1,void *buf2,size_t count)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  byte bVar4;
  
  if (7 < count) {
    do {
      uVar2 = *buf1;
      uVar1 = *buf2;
      *(ulong *)buf1 = uVar2 ^ uVar1;
      uVar2 = uVar2 ^ uVar1 ^ *buf2;
      *(ulong *)buf2 = uVar2;
      *(ulong *)buf1 = *buf1 ^ uVar2;
      buf1 = (void *)((long)buf1 + 8);
      buf2 = (void *)((long)buf2 + 8);
      count = count - 8;
    } while (7 < count);
  }
  if (count != 0) {
    sVar3 = 0;
    do {
      bVar4 = *(byte *)((long)buf1 + sVar3) ^ *(byte *)((long)buf2 + sVar3);
      *(byte *)((long)buf1 + sVar3) = bVar4;
      bVar4 = bVar4 ^ *(byte *)((long)buf2 + sVar3);
      *(byte *)((long)buf2 + sVar3) = bVar4;
      *(byte *)((long)buf1 + sVar3) = *(byte *)((long)buf1 + sVar3) ^ bVar4;
      sVar3 = sVar3 + 1;
    } while (count != sVar3);
  }
  return;
}

Assistant:

void memSwap(void* buf1, void* buf2, size_t count)
{
	ASSERT(memIsDisjoint(buf1, buf2, count));
	for (; count >= O_PER_W; count -= O_PER_W)
	{
		SWAP(*(word*)buf1, *(word*)buf2);
		buf1 = (word*)buf1 + 1;
		buf2 = (word*)buf2 + 1;
	}
	while (count--)
	{
		SWAP(*(octet*)buf1, *(octet*)buf2);
		buf1 = (octet*)buf1 + 1;
		buf2 = (octet*)buf2 + 1;
	}
}